

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O1

void printTree0(NodeAVL *nd,int nest)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  iVar3 = nest * 10;
  while( true ) {
    iVar5 = 1;
    if (1 < iVar3) {
      iVar5 = iVar3;
    }
    if (nd == (NodeAVL *)0x0) break;
    if (0 < nest) {
      do {
        putchar(0x20);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    uVar1 = 0xffffffff;
    uVar2 = 0xffffffff;
    if (nd->parent != (NodeAVL *)0x0) {
      uVar2 = (ulong)(uint)nd->parent->id;
    }
    if (nd->left != (NodeAVL *)0x0) {
      uVar1 = (ulong)(uint)nd->left->id;
    }
    if (nd->right == (NodeAVL *)0x0) {
      uVar4 = 0xffffffff;
    }
    else {
      uVar4 = (ulong)(uint)nd->right->id;
    }
    printf("n=%3d k=%6.4f p=%3d l=%3d r=%3d\n",nd->key,(ulong)(uint)nd->id,uVar2,uVar1,uVar4);
    nest = nest + 1;
    printTree0(nd->left,nest);
    nd = nd->right;
    iVar3 = iVar3 + 10;
  }
  return;
}

Assistant:

static
void printTree0( NodeAVL *nd, const int nest ){
    if ( !nd ) return;
    int i; for ( i = 0; i < 10*nest; ++i ) printf( " " );
    int node = nd->id, lSon = -1, rSon=-1, parent = -1;
    if ( nd->parent ) parent = nd->parent->id;
    if ( nd->left ) lSon = nd->left->id;
    if ( nd->right ) rSon = nd->right->id;
    printf( "n=%3d k=%6.4f p=%3d l=%3d r=%3d\n", node, nd->key, parent, lSon, rSon );
    printTree0( nd->left, nest+1 );
    printTree0( nd->right, nest+1 );
}